

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O1

void __thiscall Cleaner::RemoveEdgeFiles(Cleaner *this,Edge *edge)

{
  string rspfile;
  string depfile;
  string local_58;
  string local_38;
  
  Edge::GetUnescapedDepfile_abi_cxx11_(&local_38,edge);
  if (local_38._M_string_length != 0) {
    Remove(this,&local_38);
  }
  Edge::GetUnescapedRspfile_abi_cxx11_(&local_58,edge);
  if (local_58._M_string_length != 0) {
    Remove(this,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Cleaner::RemoveEdgeFiles(Edge* edge) {
  string depfile = edge->GetUnescapedDepfile();
  if (!depfile.empty())
    Remove(depfile);

  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty())
    Remove(rspfile);
}